

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

void __thiscall
libcellml::Analyser::AnalyserImpl::updateUnitsMap
          (AnalyserImpl *this,ModelPtr *model,string *unitsName,UnitsMap *unitsMap,bool userUnitsMap
          ,double unitsExponent,double unitsMultiplier)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  size_t sVar5;
  AnalyserImpl *pAVar6;
  undefined7 in_register_00000081;
  size_t i;
  ulong index;
  UnitsPtr units;
  string id;
  double multiplier;
  double exponent;
  string prefix;
  string reference;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  Model local_c8;
  double local_a8;
  string local_a0;
  double local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70;
  pointer local_50;
  pointer local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unitsExponent;
  local_c8.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)unitsMultiplier;
  if ((int)CONCAT71(in_register_00000081,userUnitsMap) == 0) {
    pAVar6 = (AnalyserImpl *)unitsName;
    bVar1 = isStandardUnitName(unitsName);
    if (bVar1) {
      updateUnitsMapWithStandardUnit(pAVar6,unitsName,unitsMap,(double)local_d8);
      return;
    }
    Model::units(&local_c8,
                 (string *)
                 (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    bVar1 = Units::isBaseUnit((Units *)local_c8.super_ComponentEntity.super_NamedEntity.
                                       super_ParentedEntity.super_Entity._vptr_Entity);
    if (bVar1) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              ::find(&unitsMap->_M_t,unitsName);
      if ((_Rb_tree_header *)iVar3._M_node == &(unitsMap->_M_t)._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,double&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                    *)unitsMap,unitsName,(double *)&local_d8);
      }
      else {
        local_d0 = local_d8;
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[](unitsMap,(key_type *)(iVar3._M_node + 1));
        *pmVar4 = (double)local_d0 + *pmVar4;
      }
    }
    else {
      local_50 = (pointer)&stack0xffffffffffffffc0;
      index = 0;
      local_48 = (pointer)0x0;
      local_40 = 0;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      while( true ) {
        sVar5 = Units::unitCount((Units *)local_c8.super_ComponentEntity.super_NamedEntity.
                                          super_ParentedEntity.super_Entity._vptr_Entity);
        if (sVar5 <= index) break;
        Units::unitAttributes
                  ((Units *)local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                            super_Entity._vptr_Entity,index,(string *)&stack0xffffffffffffffb0,
                   &local_70,(double *)&local_78,&local_80,&local_a0);
        pAVar6 = (AnalyserImpl *)&stack0xffffffffffffffb0;
        bVar1 = isStandardUnitName((string *)&stack0xffffffffffffffb0);
        if (bVar1) {
          updateUnitsMapWithStandardUnit
                    (pAVar6,(string *)&stack0xffffffffffffffb0,unitsMap,
                     (double)local_78 * (double)local_d8);
        }
        else {
          local_c8.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
          super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_d8;
          local_d0 = local_78;
          local_a8 = log10(local_80);
          iVar2 = convertPrefixToInt(&local_70,(bool *)0x0);
          updateUnitsMap(this,model,(string *)&stack0xffffffffffffffb0,unitsMap,false,
                         (double)local_d0 *
                         (double)local_c8.super_enable_shared_from_this<libcellml::Model>.
                                 _M_weak_this.
                                 super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,
                         (local_a8 + (double)iVar2) * (double)local_d8 +
                         (double)local_c8.super_enable_shared_from_this<libcellml::Model>.
                                 _M_weak_this.
                                 super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
        }
        index = index + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,
                        CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                 local_a0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if (local_50 != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c8.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)unitsName);
    if (iVar2 != 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,double&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                  *)unitsMap,unitsName,(double *)&local_d8);
    }
  }
  return;
}

Assistant:

void Analyser::AnalyserImpl::updateUnitsMap(const ModelPtr &model,
                                            const std::string &unitsName,
                                            UnitsMap &unitsMap,
                                            bool userUnitsMap,
                                            double unitsExponent,
                                            double unitsMultiplier)
{
    // Update the given units map using the given information.

    if (userUnitsMap) {
        if (unitsName != "dimensionless") {
            unitsMap.emplace(unitsName, unitsExponent);
        }
    } else {
        if (isStandardUnitName(unitsName)) {
            updateUnitsMapWithStandardUnit(unitsName, unitsMap, unitsExponent);
        } else {
            UnitsPtr units = model->units(unitsName);

            if (units->isBaseUnit()) {
                auto iter = unitsMap.find(unitsName);

                if (iter == unitsMap.end()) {
                    unitsMap.emplace(unitsName, unitsExponent);
                } else {
                    unitsMap[iter->first] += unitsExponent;
                }
            } else {
                std::string reference;
                std::string prefix;
                double exponent;
                double multiplier;
                std::string id;

                for (size_t i = 0; i < units->unitCount(); ++i) {
                    units->unitAttributes(i, reference, prefix, exponent, multiplier, id);

                    if (isStandardUnitName(reference)) {
                        updateUnitsMapWithStandardUnit(reference, unitsMap, exponent * unitsExponent);
                    } else {
                        updateUnitsMap(model, reference, unitsMap, userUnitsMap,
                                       exponent * unitsExponent,
                                       unitsMultiplier + (std::log10(multiplier) + convertPrefixToInt(prefix)) * unitsExponent);
                    }
                }
            }
        }
    }
}